

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxSizeAlign::Resolve(FxSizeAlign *this,FCompileContext *ctx)

{
  undefined4 uVar1;
  PType *pPVar2;
  PInt *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar5;
  FxExpression *pFVar6;
  char *pcVar7;
  char *message;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->Operand != (FxExpression *)0x0) {
      iVar4 = (*this->Operand->_vptr_FxExpression[2])();
      pFVar6 = (FxExpression *)CONCAT44(extraout_var,iVar4);
      this->Operand = pFVar6;
      if (pFVar6 != (FxExpression *)0x0) {
        pPVar2 = pFVar6->ValueType;
        iVar4 = (*pFVar6->_vptr_FxExpression[3])(pFVar6);
        if ((char)iVar4 == '\0') {
          iVar4 = (*this->Operand->_vptr_FxExpression[4])(this->Operand,ctx,0);
          if ((char)iVar4 != '\0') {
            plVar5 = (long *)FMemArena::Alloc(&FxAlloc,0x38);
            uVar1 = *(undefined4 *)
                     (&(pPVar2->super_PTypeBase).super_DObject.field_0x24 +
                     (ulong)(this->Which == 0x180) * 4);
            pFVar6 = this->Operand;
            *plVar5 = (long)&PTR__FxExpression_0070d370;
            FScriptPosition::FScriptPosition
                      ((FScriptPosition *)(plVar5 + 1),&pFVar6->ScriptPosition);
            *(undefined1 *)((long)plVar5 + 0x21) = 1;
            *(undefined4 *)((long)plVar5 + 0x24) = 4;
            *plVar5 = (long)&PTR__FxConstant_0070d3e8;
            pPVar3 = TypeSInt32;
            plVar5[5] = (long)TypeSInt32;
            plVar5[3] = (long)pPVar3;
            *(undefined4 *)(plVar5 + 6) = uVar1;
            *(undefined1 *)(plVar5 + 4) = 1;
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            pFVar6 = (FxExpression *)(**(code **)(*plVar5 + 0x10))(plVar5,ctx);
            return pFVar6;
          }
          pcVar7 = "size";
          if (this->Which == 0x180) {
            pcVar7 = "alignment";
          }
          message = "Operand must be addressable to determine %s";
        }
        else {
          pcVar7 = "size";
          if (this->Which == 0x180) {
            pcVar7 = "alignment";
          }
          message = "cannot determine %s of a constant";
        }
        FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message,pcVar7);
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxSizeAlign *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxSizeAlign::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	auto type = Operand->ValueType;
	if (Operand->isConstant())
	{
		ScriptPosition.Message(MSG_ERROR, "cannot determine %s of a constant", Which == TK_AlignOf? "alignment" : "size");
		delete this;
		return nullptr;
	}
	else if (!Operand->RequestAddress(ctx, nullptr))
	{
		ScriptPosition.Message(MSG_ERROR, "Operand must be addressable to determine %s", Which == TK_AlignOf ? "alignment" : "size");
		delete this;
		return nullptr;
	}
	else
	{
		FxExpression *x = new FxConstant(Which == TK_AlignOf ? int(type->Align) : int(type->Size), Operand->ScriptPosition);
		delete this;
		return x->Resolve(ctx);
	}
}